

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O1

void attoAppInit(AAppProctable *proctable)

{
  uint uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  AGLProgram AVar8;
  AGLProgram AVar9;
  TriVertex *pTVar10;
  undefined4 uVar11;
  long lVar12;
  long lVar13;
  undefined8 *puVar14;
  long lVar15;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  AVec3f AVar20;
  AVec3f AVar21;
  char *vvertex [2];
  float local_d8;
  float fStack_d4;
  ALCGRand local_a8;
  undefined8 uStack_a0;
  AAppProctable *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  char *local_48;
  undefined8 uStack_40;
  
  local_90 = proctable;
  aGLInit();
  local_a8.state_ = 0x4000;
  g.vertices_count = 0x18000;
  g.vertices = (TriVertex *)malloc(0x480000);
  lVar15 = 0;
  do {
    pTVar10 = g.vertices;
    AVar20 = randomVector(&local_a8,1.0);
    fVar18 = AVar20.z;
    *(long *)((long)&pTVar10[2].tricenter.x + lVar15) = AVar20._0_8_;
    *(float *)((long)&pTVar10[2].tricenter.z + lVar15) = fVar18;
    uVar3 = *(undefined8 *)((long)&pTVar10[2].tricenter.x + lVar15);
    *(undefined8 *)((long)&pTVar10[1].tricenter.x + lVar15) = uVar3;
    uVar11 = *(undefined4 *)((long)&pTVar10[2].tricenter.z + lVar15);
    *(undefined4 *)((long)&pTVar10[1].tricenter.z + lVar15) = uVar11;
    *(undefined8 *)((long)&(pTVar10->tricenter).x + lVar15) = uVar3;
    *(undefined4 *)((long)&(pTVar10->tricenter).z + lVar15) = uVar11;
    AVar21 = randomVector(&local_a8,0.1);
    local_d8 = AVar20.x;
    fStack_d4 = AVar20.y;
    local_68 = AVar21.x + local_d8;
    fStack_64 = AVar21.y + fStack_d4;
    fStack_60 = extraout_XMM0_Dc_00 + extraout_XMM0_Dc;
    fStack_5c = extraout_XMM0_Dd_00 + extraout_XMM0_Dd;
    fVar16 = AVar21.z + fVar18;
    *(ulong *)((long)&(pTVar10->pos).x + lVar15) = CONCAT44(fStack_64,local_68);
    *(float *)((long)&(pTVar10->pos).z + lVar15) = fVar16;
    local_58 = fStack_64;
    fStack_54 = fStack_64;
    fStack_50 = fStack_64;
    fStack_4c = fStack_64;
    AVar20 = randomVector(&local_a8,0.1);
    local_88 = AVar20.x + local_d8;
    fStack_84 = AVar20.y + fStack_d4;
    fStack_80 = extraout_XMM0_Dc_01 + extraout_XMM0_Dc;
    fStack_7c = extraout_XMM0_Dd_01 + extraout_XMM0_Dd;
    fVar17 = AVar20.z + fVar18;
    *(ulong *)((long)&pTVar10[1].pos.x + lVar15) = CONCAT44(fStack_84,local_88);
    *(float *)((long)&pTVar10[1].pos.z + lVar15) = fVar17;
    local_78 = fStack_84;
    fStack_74 = fStack_84;
    fStack_70 = fStack_84;
    fStack_6c = fStack_84;
    AVar20 = randomVector(&local_a8,0.1);
    local_d8 = AVar20.x + local_d8;
    fStack_d4 = AVar20.y + fStack_d4;
    fVar18 = AVar20.z + fVar18;
    *(ulong *)((long)&pTVar10[2].pos.x + lVar15) = CONCAT44(fStack_d4,local_d8);
    *(float *)((long)&pTVar10[2].pos.z + lVar15) = fVar18;
    fVar16 = fVar16 - fVar17;
    local_d8 = local_d8 - local_88;
    fStack_d4 = fStack_d4 - local_78;
    fVar18 = fVar18 - fVar17;
    fVar19 = (local_58 - local_78) * fVar18 - fVar16 * fStack_d4;
    fVar17 = fVar16 * local_d8 - fVar18 * (local_68 - local_88);
    fVar18 = fStack_d4 * (local_68 - local_88) - local_d8 * (local_58 - local_78);
    fVar16 = fVar18 * fVar18 + fVar19 * fVar19 + fVar17 * fVar17;
    if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    puVar14 = (undefined8 *)((long)&(pTVar10->pos).x + lVar15);
    fVar16 = 1.0 / fVar16;
    *(ulong *)((long)&pTVar10[2].normal.x + lVar15) = CONCAT44(fVar17 * fVar16,fVar19 * fVar16);
    *(float *)((long)&pTVar10[2].normal.z + lVar15) = fVar16 * fVar18;
    *(undefined4 *)((long)&pTVar10[1].normal.z + lVar15) =
         *(undefined4 *)((long)&pTVar10[2].normal.z + lVar15);
    *(undefined8 *)((long)&pTVar10[1].normal.x + lVar15) =
         *(undefined8 *)((long)&pTVar10[2].normal.x + lVar15);
    *(undefined4 *)((long)&(pTVar10->normal).z + lVar15) =
         *(undefined4 *)((long)&pTVar10[2].normal.z + lVar15);
    *(undefined8 *)((long)&(pTVar10->normal).x + lVar15) =
         *(undefined8 *)((long)&pTVar10[2].normal.x + lVar15);
    lVar12 = local_a8.state_ * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    lVar13 = lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    local_a8.state_ = lVar13 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    *(ulong *)((long)&pTVar10[2].color.x + lVar15) =
         CONCAT44((float)((uint)((ulong)lVar13 >> 0x18) & 0xffffff) / 16777215.0,
                  (float)((uint)((ulong)lVar12 >> 0x18) & 0xffffff) / 16777215.0);
    *(float *)((long)&pTVar10[2].color.z + lVar15) =
         (float)((uint)(local_a8.state_ >> 0x18) & 0xffffff) / 16777215.0;
    uVar3 = *(undefined8 *)((long)&pTVar10[2].color.x + lVar15);
    *(undefined8 *)((long)&pTVar10[1].color.x + lVar15) = uVar3;
    uVar11 = *(undefined4 *)((long)&pTVar10[2].color.z + lVar15);
    *(undefined4 *)((long)&pTVar10[1].color.z + lVar15) = uVar11;
    *(undefined4 *)((long)&(pTVar10->color).z + lVar15) = uVar11;
    *(undefined8 *)((long)&(pTVar10->color).x + lVar15) = uVar3;
    uVar3 = *puVar14;
    uVar4 = puVar14[1];
    uVar5 = puVar14[2];
    uVar6 = puVar14[3];
    uVar7 = puVar14[5];
    *(undefined8 *)((long)&pTVar10[3].normal.z + lVar15) = puVar14[4];
    *(undefined8 *)((long)&pTVar10[3].color.y + lVar15) = uVar7;
    *(undefined8 *)((long)&pTVar10[3].tricenter.y + lVar15) = uVar5;
    *(undefined8 *)((long)&pTVar10[3].normal.x + lVar15) = uVar6;
    *(undefined8 *)((long)&pTVar10[3].pos.x + lVar15) = uVar3;
    *(undefined8 *)((long)&pTVar10[3].pos.z + lVar15) = uVar4;
    uVar3 = *(undefined8 *)((long)&pTVar10[2].pos.x + lVar15);
    uVar4 = *(undefined8 *)((long)&pTVar10[2].pos.z + lVar15);
    uVar5 = *(undefined8 *)((long)&pTVar10[2].tricenter.y + lVar15);
    uVar6 = *(undefined8 *)((long)&pTVar10[2].normal.x + lVar15);
    uVar7 = *(undefined8 *)((long)&pTVar10[2].color.y + lVar15);
    *(undefined8 *)((long)&pTVar10[4].normal.z + lVar15) =
         *(undefined8 *)((long)&pTVar10[2].normal.z + lVar15);
    *(undefined8 *)((long)&pTVar10[4].color.y + lVar15) = uVar7;
    *(undefined8 *)((long)&pTVar10[4].tricenter.y + lVar15) = uVar5;
    *(undefined8 *)((long)&pTVar10[4].normal.x + lVar15) = uVar6;
    *(undefined8 *)((long)&pTVar10[4].pos.x + lVar15) = uVar3;
    *(undefined8 *)((long)&pTVar10[4].pos.z + lVar15) = uVar4;
    uVar4 = *(undefined8 *)((long)&pTVar10[1].pos.z + lVar15);
    uVar5 = *(undefined8 *)((long)&pTVar10[1].tricenter.y + lVar15);
    uVar6 = *(undefined8 *)((long)&pTVar10[1].normal.x + lVar15);
    uVar11 = *(undefined4 *)((long)&pTVar10[1].normal.z + lVar15);
    uVar3 = *(undefined8 *)((long)&pTVar10[1].color.x + lVar15);
    uVar2 = *(undefined4 *)((long)&pTVar10[1].color.z + lVar15);
    *(undefined8 *)((long)&pTVar10[5].pos.x + lVar15) =
         *(undefined8 *)((long)&pTVar10[1].pos.x + lVar15);
    *(undefined8 *)((long)&pTVar10[5].pos.z + lVar15) = uVar4;
    *(undefined8 *)((long)&pTVar10[5].tricenter.y + lVar15) = uVar5;
    *(undefined8 *)((long)&pTVar10[5].normal.x + lVar15) = uVar6;
    *(undefined4 *)((long)&pTVar10[5].normal.z + lVar15) = uVar11;
    *(undefined8 *)((long)&pTVar10[5].color.x + lVar15) = uVar3;
    *(undefined4 *)((long)&pTVar10[5].color.z + lVar15) = uVar2;
    uVar1 = *(uint *)((long)&(pTVar10->normal).z + lVar15);
    *(ulong *)((long)&pTVar10[5].normal.x + lVar15) =
         *(ulong *)((long)&(pTVar10->normal).x + lVar15) ^ 0x8000000080000000;
    *(uint *)((long)&pTVar10[5].normal.z + lVar15) = uVar1 ^ 0x80000000;
    uVar3 = *(undefined8 *)((long)&pTVar10[5].normal.x + lVar15);
    *(undefined8 *)((long)&pTVar10[4].normal.x + lVar15) = uVar3;
    uVar11 = *(undefined4 *)((long)&pTVar10[5].normal.z + lVar15);
    *(undefined4 *)((long)&pTVar10[4].normal.z + lVar15) = uVar11;
    *(undefined8 *)((long)&pTVar10[3].normal.x + lVar15) = uVar3;
    *(undefined4 *)((long)&pTVar10[3].normal.z + lVar15) = uVar11;
    lVar15 = lVar15 + 0x120;
  } while (lVar15 != 0x480000);
  uStack_a0 = 0;
  uStack_40 = 0;
  local_a8.state_ = 0x1070e0;
  local_48 = "varying vec3 vv3_color;\nvoid main() {\n  gl_FragColor = vec4(vv3_color, 1.);\n}";
  g.draw.program = aGLProgramCreate((char **)&local_a8,&local_48);
  if (g.draw.program < 1) {
    aAppDebugPrintf("shader error: %s",a_gl_error);
  }
  AVar8 = g.draw.program;
  g.attr[0].name = "av3_pos";
  g.attr[0].buffer = (AGLBuffer *)0x0;
  g.attr[0].size = 3;
  g.attr[0].type = 0x1406;
  g.attr[0].normalized = '\0';
  g.attr[0].stride = 0x30;
  g.attr[0].ptr = g.vertices;
  g.attr[2].name = "av3_normal";
  g.attr[2].buffer = (AGLBuffer *)0x0;
  g.attr[2].size = 3;
  g.attr[2].type = 0x1406;
  g.attr[2].normalized = '\0';
  g.attr[2].stride = 0x30;
  g.attr[2].ptr = &(g.vertices)->normal;
  g.attr[1].name = "av3_tricenter";
  g.attr[1].buffer = (AGLBuffer *)0x0;
  g.attr[1].size = 3;
  g.attr[1].type = 0x1406;
  g.attr[1].normalized = '\0';
  g.attr[1].stride = 0x30;
  g.attr[1].ptr = &(g.vertices)->tricenter;
  g.attr[3].name = "av3_color";
  g.attr[3].buffer = (AGLBuffer *)0x0;
  g.attr[3].size = 3;
  g.attr[3].type = 0x1406;
  g.attr[3].normalized = '\0';
  g.attr[3].stride = 0x30;
  g.attr[3].ptr = &(g.vertices)->color;
  g.pun[0].name = "um4_vp";
  g.pun[0].type = AGLAT_Mat4;
  g.pun[0].count = 1;
  g.pun[1].name = "um4_model";
  g.pun[1].type = AGLAT_Mat4;
  g.pun[1].count = 1;
  g.pun[2].name = "uv3_lightpos";
  g.pun[2].type = AGLAT_Vec3;
  g.pun[2].count = 1;
  g.draw.primitive.mode = 4;
  g.draw.primitive.count = g.vertices_count;
  g.draw.primitive.first = 0;
  g.draw.primitive.index.data.ptr = (GLvoid *)0x0;
  g.draw.primitive.index.buffer = (AGLBuffer *)0x0;
  g.draw.primitive.cull_mode = AGLCM_Front;
  g.draw.primitive.front_face = AGLFF_CounterClockwise;
  g.draw.attribs.p = g.attr;
  g.draw.attribs.n = 4;
  lVar15 = 0x28;
  do {
    uVar11 = glGetAttribLocation(AVar8,*(undefined8 *)(a_gl_error + lVar15 + 0x3d8));
    *(undefined4 *)((long)&g.attr[0].name + lVar15) = uVar11;
    AVar9 = g.draw.program;
    lVar15 = lVar15 + 0x30;
  } while (lVar15 != 0xe8);
  g.draw.uniforms.p = g.pun;
  g.draw.uniforms.n = 3;
  lVar15 = 0;
  do {
    uVar11 = glGetUniformLocation(AVar9,*(undefined8 *)((long)&g.pun[0].name + lVar15));
    *(undefined4 *)((long)&g.pun[0]._.location + lVar15) = uVar11;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x60);
  g.merge.blend.enable = 0;
  g.merge.depth.mode = AGLDM_TestAndWrite;
  g.merge.depth.func = AGLDF_Less;
  local_90->resize = resize;
  local_90->paint = paint;
  local_90->key = keyPress;
  return;
}

Assistant:

void attoAppInit(struct AAppProctable *proctable) {
	aGLInit();
	init();

	proctable->resize = resize;
	proctable->paint = paint;
	proctable->key = keyPress;
}